

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int libssh2_sign_sk(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  undefined4 *puVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  uchar *p;
  LIBSSH2_SK_SIG_INFO sig_info;
  uchar *x;
  uchar *local_70;
  undefined8 local_68;
  uchar *puStack_60;
  size_t local_58;
  uchar *puStack_50;
  size_t local_48;
  uchar *local_38;
  
  puVar1 = (undefined4 *)*abstract;
  local_58 = 0;
  puStack_50 = (uchar *)0x0;
  local_68 = 0;
  puStack_60 = (uchar *)0x0;
  local_48 = 0;
  if (*(long *)(puVar1 + 6) == 0) {
    return -0xc;
  }
  iVar2 = (**(code **)(puVar1 + 8))
                    (session,&local_68,data,data_len,*puVar1,*(undefined1 *)(puVar1 + 1),puVar1[2],
                     puVar1[4],*(long *)(puVar1 + 6),*(undefined8 *)(puVar1 + 10));
  if (((iVar2 != 0) || (local_58 == 0)) || (puStack_60 == (uchar *)0x0)) {
    *sig_len = 0;
    return iVar2;
  }
  local_70 = (uchar *)0x0;
  if ((local_48 == 0) || (puStack_50 == (uchar *)0x0)) {
    *sig_len = local_58 + 9;
    puVar3 = (uchar *)(*session->alloc)(local_58 + 9,&session->abstract);
    *sig = puVar3;
    if (puVar3 != (uchar *)0x0) {
      local_70 = puVar3;
      _libssh2_store_str(&local_70,(char *)puStack_60,local_58);
      iVar2 = 0;
      goto LAB_0012b55f;
    }
  }
  else {
    sVar4 = local_58 + local_48 + 0x13;
    *sig_len = sVar4;
    puVar3 = (uchar *)(*session->alloc)(sVar4,&session->abstract);
    *sig = puVar3;
    if (puVar3 != (uchar *)0x0) {
      iVar2 = 0;
      local_70 = puVar3;
      local_38 = puVar3;
      _libssh2_store_u32(&local_70,0);
      _libssh2_store_bignum2_bytes(&local_70,puStack_60,local_58);
      _libssh2_store_bignum2_bytes(&local_70,puStack_50,local_48);
      puVar3 = *sig;
      *sig_len = (long)local_70 - (long)puVar3;
      _libssh2_store_u32(&local_38,(int)((long)local_70 - (long)puVar3) - 4);
      goto LAB_0012b55f;
    }
  }
  iVar2 = -6;
LAB_0012b55f:
  if (local_70 != (uchar *)0x0) {
    *local_70 = (uchar)local_68;
    local_70 = local_70 + 1;
    _libssh2_store_u32(&local_70,local_68._4_4_);
    *sig_len = (long)local_70 - (long)*sig;
  }
  (*session->free)(puStack_60,&session->abstract);
  if (puStack_50 != (uchar *)0x0) {
    (*session->free)(puStack_50,&session->abstract);
  }
  return iVar2;
}

Assistant:

int
libssh2_sign_sk(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    int rc = LIBSSH2_ERROR_DECRYPT;
    LIBSSH2_PRIVKEY_SK *sk_info = (LIBSSH2_PRIVKEY_SK *) (*abstract);
    LIBSSH2_SK_SIG_INFO sig_info = { 0 };

    if(sk_info->handle_len <= 0) {
        return LIBSSH2_ERROR_DECRYPT;
    }

    rc = sk_info->sign_callback(session,
                                &sig_info,
                                data,
                                data_len,
                                sk_info->algorithm,
                                sk_info->flags,
                                sk_info->application,
                                sk_info->key_handle,
                                sk_info->handle_len,
                                sk_info->orig_abstract);

    if(rc == 0 && sig_info.sig_r_len > 0 && sig_info.sig_r) {
        unsigned char *p = NULL;

        if(sig_info.sig_s_len > 0 && sig_info.sig_s) {
            /* sig length, sig_r, sig_s, flags, counter, plus 4 bytes for each
               component's length, and up to 1 extra byte for each component */
            *sig_len = 4 + 5 + sig_info.sig_r_len + 5 + sig_info.sig_s_len + 5;
            *sig = LIBSSH2_ALLOC(session, *sig_len);

            if(*sig) {
                unsigned char *x = *sig;
                p = *sig;

                _libssh2_store_u32(&p, 0);

                _libssh2_store_bignum2_bytes(&p,
                                             sig_info.sig_r,
                                             sig_info.sig_r_len);

                _libssh2_store_bignum2_bytes(&p,
                                             sig_info.sig_s,
                                             sig_info.sig_s_len);

                *sig_len = p - *sig;

                _libssh2_store_u32(&x, (uint32_t)(*sig_len - 4));
            }
            else {
                _libssh2_debug((session,
                               LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate ecdsa-sk signature."));
                rc = LIBSSH2_ERROR_ALLOC;
            }
        }
        else {
            /* sig, flags, counter, plus 4 bytes for sig length. */
            *sig_len = 4 + sig_info.sig_r_len + 1 + 4;
            *sig = LIBSSH2_ALLOC(session, *sig_len);

            if(*sig) {
                p = *sig;

                _libssh2_store_str(&p,
                                   (const char *)sig_info.sig_r,
                                   sig_info.sig_r_len);
            }
            else {
                _libssh2_debug((session,
                               LIBSSH2_ERROR_ALLOC,
                               "Unable to allocate ed25519-sk signature."));
                rc = LIBSSH2_ERROR_ALLOC;
            }
        }

        if(p) {
            *p = sig_info.flags;
            ++p;
            _libssh2_store_u32(&p, sig_info.counter);

            *sig_len = p - *sig;
        }

        LIBSSH2_FREE(session, sig_info.sig_r);

        if(sig_info.sig_s) {
            LIBSSH2_FREE(session, sig_info.sig_s);
        }
    }
    else {
        _libssh2_debug((session,
                       LIBSSH2_ERROR_DECRYPT,
                       "sign_callback failed or returned invalid signature."));
        *sig_len = 0;
    }

    return rc;
}